

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmload(mcmcxdef *cctx,mcmon cnum)

{
  undefined8 uVar1;
  mcsseg seg;
  int iVar2;
  size_t sVar3;
  ushort in_SI;
  undefined8 *in_RDI;
  errdef fr_;
  mcmon num;
  mcmon newn;
  mcmodef *newdef;
  mcmodef *o;
  mcmcx1def *ctx;
  undefined6 in_stack_fffffffffffffe88;
  mcmon in_stack_fffffffffffffe8e;
  undefined2 uVar4;
  errcxdef *in_stack_fffffffffffffe90;
  long lVar5;
  undefined1 local_168 [6];
  uint in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffec0;
  mcmon in_stack_fffffffffffffec6;
  mcmon *in_stack_fffffffffffffec8;
  ushort in_stack_fffffffffffffed6;
  mcmcxdef *in_stack_fffffffffffffed8;
  __jmp_buf_tag _Stack_f8;
  undefined2 local_2c;
  ushort local_2a;
  long *local_28;
  long *local_20;
  long *local_18;
  ushort local_a;
  undefined8 *local_8;
  
  local_18 = (long *)*in_RDI;
  local_20 = (long *)(*(long *)(*(long *)*in_RDI +
                               (long)((int)(uint)*(ushort *)
                                                  (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                                  (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
                     (long)(int)(*(ushort *)
                                  (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                  (long)(int)(in_SI & 0xff) * 2) & 0xff) * 0x20);
  local_2c = *(undefined2 *)
              (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2);
  local_a = in_SI;
  local_8 = in_RDI;
  mcmalo0(in_stack_fffffffffffffed8,in_stack_fffffffffffffed6,in_stack_fffffffffffffec8,
          in_stack_fffffffffffffec6,in_stack_fffffffffffffec0);
  local_28 = (long *)(*(long *)(*local_18 + (long)((int)(uint)local_2a >> 8) * 8) +
                     (long)(int)(local_2a & 0xff) * 0x20);
  *local_20 = *local_28;
  *(short *)(local_20 + 3) = (short)local_28[3];
  iVar2 = _setjmp(&_Stack_f8);
  if (iVar2 != 0) {
    *(undefined8 *)local_18[1] = _local_168;
    mcmgunlck((mcmcx1def *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
    mcmgfre((mcmcx1def *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
    errrse1(in_stack_fffffffffffffe90,
            (errdef *)CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88));
  }
  uVar1 = *(undefined8 *)local_18[1];
  *(undefined1 **)local_18[1] = local_168;
  _local_168 = uVar1;
  if ((*(ushort *)((long)local_20 + 0x14) & 3) == 0) {
    if (local_8[2] == 0) {
      errsigf(in_stack_fffffffffffffe90,
              (char *)CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88),0);
    }
    (*(code *)local_8[2])(local_8[3],local_20[1],*local_20,(short)local_20[3]);
  }
  else {
    seg = (mcsseg)((ulong)uVar1 >> 0x30);
    mcsin((mcscxdef *)((ulong)in_stack_fffffffffffffea4 << 0x20),seg,
          (uchar *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
  }
  *(undefined8 *)local_18[1] = _local_168;
  lVar5 = *local_20;
  uVar4 = local_2c;
  sVar3 = osrndsz(2);
  *(undefined2 *)(lVar5 - sVar3) = uVar4;
  *(undefined2 *)((long)local_28 + 0x14) = 0;
  *(undefined2 *)(local_28 + 2) = *(undefined2 *)((long)local_18 + 0x6e);
  *(ushort *)((long)local_18 + 0x6e) = local_2a;
  *(ushort *)((long)local_20 + 0x14) = *(ushort *)((long)local_20 + 0x14) | 0xc;
  *(ushort *)((long)local_20 + 0x14) = *(ushort *)((long)local_20 + 0x14) & 0xfffe;
  *(ushort *)((long)local_20 + 0x14) = *(ushort *)((long)local_20 + 0x14) | 2;
  *(undefined1 *)((long)local_20 + 0x16) = 1;
  if ((*(ushort *)((long)local_20 + 0x14) & 0x100) != 0) {
    (*(code *)local_8[4])(local_8[5],local_a);
    *(ushort *)((long)local_20 + 0x14) = *(ushort *)((long)local_20 + 0x14) & 0xfeff;
  }
  return (uchar *)*local_20;
}

Assistant:

uchar *mcmload(mcmcxdef *cctx, mcmon cnum)
{
    mcmcx1def   *ctx = cctx->mcmcxgl;
    mcmodef     *o = mcmobje(cctx, cnum);
    mcmodef     *newdef;
    mcmon        newn;
    mcmon        num = mcmc2g(cctx, cnum);
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);

    /* we first need to obtain some memory for this object */
    (void)mcmalo0(cctx, o->mcmosiz, &newn, MCMONINV, TRUE);
    newdef = mcmgobje(ctx, newn);
    
    /* use memory block from our new object */
    o->mcmoptr = newdef->mcmoptr;
    o->mcmosiz = newdef->mcmosiz;

    /* load or swap the object in */
    ERRBEGIN(ctx->mcmcxerr)
        if (o->mcmoflg & (MCMOFNODISC | MCMOFDIRTY))
            mcsin(&ctx->mcmcxswc, o->mcmoswh, o->mcmoptr, o->mcmosiz);
        else if (cctx->mcmcxldf)
            (*cctx->mcmcxldf)(cctx->mcmcxldc, o->mcmoldh, o->mcmoptr,
                              o->mcmosiz);
        else
            errsig(ctx->mcmcxerr, ERR_NOLOAD);
    ERRCLEAN(ctx->mcmcxerr)
        mcmgunlck(ctx, newn);                          /* unlock the object */
        mcmgfre(ctx, newn);              /* don't need new memory after all */
    ERRENDCLN(ctx->mcmcxerr)

    /* unuse the new cache entry we obtained (we just wanted the memory) */
/* @@@ */
    *(mcmon *)(o->mcmoptr - osrndsz(sizeof(mcmon))) = num;      /* set obj# */
    newdef->mcmoflg = 0;                        /* mark new block as unused */
    newdef->mcmonxt = ctx->mcmcxunu;                /* link to unused chain */
    ctx->mcmcxunu = newn;

    /* set flags in the newly loaded object and return */
    o->mcmoflg |= MCMOFPRES | MCMOFLOCK; /* object is now present in memory */
    o->mcmoflg &= ~MCMOFDIRTY;         /* not written since last swapped in */
    o->mcmoflg |= MCMOFNODISC; /* don't discard once it's been to swap file */
    o->mcmolcnt = 1;                                   /* one locker so far */
    
    /* if the object is to be reverted upon loading, revert it now */
    if (o->mcmoflg & MCMOFREVRT)
    {
        (*cctx->mcmcxrvf)(cctx->mcmcxrvc, cnum);
        o->mcmoflg &= ~MCMOFREVRT;
    }

    return(o->mcmoptr);
}